

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

Vec3 __thiscall
vkt::sr::anon_unknown_0::MatrixCaseUtils::reduceToVec3(MatrixCaseUtils *this,Mat3x4 *value)

{
  Vector<float,_3> VVar1;
  Vec3 VVar2;
  Vector<float,_3> local_50;
  Vector<float,_3> local_40;
  Vector<float,_3> local_30;
  tcu local_24 [12];
  float fVar3;
  
  local_30.m_data[2] = (value->m_data).m_data[0].m_data[2];
  local_30.m_data._0_8_ = *(undefined8 *)(value->m_data).m_data[0].m_data;
  local_40.m_data[2] = (value->m_data).m_data[1].m_data[3];
  local_40.m_data._0_8_ = *(undefined8 *)((value->m_data).m_data[1].m_data + 1);
  tcu::operator+(local_24,&local_30,&local_40);
  local_50.m_data[2] = (value->m_data).m_data[2].m_data[0];
  local_50.m_data._0_8_ = *(undefined8 *)((value->m_data).m_data[2].m_data + 2);
  VVar1 = tcu::operator+((tcu *)this,(Vector<float,_3> *)local_24,&local_50);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  return (Vec3)VVar2.m_data;
}

Assistant:

inline tcu::Vec3 reduceToVec3 (const tcu::Mat3x4& value)	{ return value.getColumn(0).swizzle(0,1,2) + value.getColumn(1).swizzle(1,2,3) + value.getColumn(2).swizzle(2,3,0); }